

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O1

void output_token_noswap(Context_conflict *ctx,uint32 token)

{
  uint pos;
  SourcePos srcpos;
  uint32 local_30;
  uint local_2c;
  char *local_28;
  ulong uStack_20;
  
  if (ctx->isfail == 0) {
    local_30 = token;
    buffer_append(ctx->output,&local_30,4);
    local_2c = 0;
    local_28 = preprocessor_sourcepos(ctx->preprocessor,&local_2c);
    uStack_20 = (ulong)local_2c;
    buffer_append(ctx->token_to_source,&local_28,0x10);
  }
  return;
}

Assistant:

static void output_token_noswap(Context *ctx, const uint32 token)
{
    if (!isfail(ctx))
    {
        buffer_append(ctx->output, &token, sizeof (token));

        // We only need a list of these that grows throughout processing, and
        //  is flattened for reference at the end of the run, so we use a
        //  Buffer. It's sneaky!
        unsigned int pos = 0;
        const char *fname = preprocessor_sourcepos(ctx->preprocessor, &pos);
        SourcePos srcpos;
        memset(&srcpos, '\0', sizeof (SourcePos));
        srcpos.line = pos;
        srcpos.filename = fname;  // cached in preprocessor!
        buffer_append(ctx->token_to_source, &srcpos, sizeof (SourcePos));
    } // if
}